

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int32 vector_cmp(float32 *v1,float32 *v2,int32 len)

{
  int local_28;
  int32 i;
  int32 len_local;
  float32 *v2_local;
  float32 *v1_local;
  
  local_28 = 0;
  while( true ) {
    if (len <= local_28) {
      return 0;
    }
    if ((float)v1[local_28] < (float)v2[local_28]) break;
    if ((float)v2[local_28] <= (float)v1[local_28] && (float)v1[local_28] != (float)v2[local_28]) {
      return 1;
    }
    local_28 = local_28 + 1;
  }
  return -1;
}

Assistant:

int32
vector_cmp(float32 * v1, float32 * v2, int32 len)
{
    int32 i;

    for (i = 0; i < len; i++) {
        if (v1[i] < v2[i])
            return -1;
        if (v1[i] > v2[i])
            return 1;
    }

    return 0;
}